

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O1

sequence * toml::detail::syntax::hex_floating(sequence *__return_storage_ptr__,spec *s)

{
  void *pvVar1;
  sequence *psVar2;
  initializer_list<unsigned_char> cs;
  initializer_list<unsigned_char> cs_00;
  initializer_list<unsigned_char> cs_01;
  initializer_list<unsigned_char> cs_02;
  uchar local_248 [8];
  maybe local_240;
  maybe local_230;
  maybe local_220;
  repeat_at_least local_210;
  sequence *local_1f8;
  character_either local_1f0;
  repeat_at_least local_1d0;
  repeat_at_least local_1b8;
  repeat_at_least local_1a0;
  character_either local_188;
  sequence local_168;
  character local_148;
  character_either local_138;
  character local_118;
  character_either local_108;
  hexdig local_e8;
  hexdig local_c0;
  sequence local_98;
  either local_78;
  hexdig local_58;
  
  local_248[6] = '+';
  local_248[7] = '-';
  cs._M_len = 2;
  cs._M_array = local_248 + 6;
  character_either::character_either(&local_108,cs);
  local_230.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__maybe_00569ae8;
  scanner_storage::scanner_storage<toml::detail::character_either,_nullptr>
            (&local_230.other_,&local_108);
  local_118.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_00569818;
  local_118.value_ = '0';
  local_248[4] = 'x';
  local_248[5] = 'X';
  cs_00._M_len = 2;
  cs_00._M_array = local_248 + 4;
  local_1f8 = __return_storage_ptr__;
  character_either::character_either(&local_138,cs_00);
  local_58.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__hexdig_0056a6b0;
  local_c0.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__digit_0056a708;
  local_c0.scanner_.super_scanner_base._vptr_scanner_base =
       (_func_int **)&PTR__scanner_base_005698d8;
  local_c0.scanner_.others_.
  super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>.
  _M_impl.super__Vector_impl_data._M_start._0_2_ = 0x3930;
  local_e8.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_005698d8;
  local_e8.scanner_.super_scanner_base._vptr_scanner_base._0_2_ = 0x6661;
  local_168.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_005698d8;
  local_168.others_.
  super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>.
  _M_impl.super__Vector_impl_data._M_start._0_2_ = 0x4641;
  either::
  either<toml::detail::syntax::digit,toml::detail::character_in_range,toml::detail::character_in_range>
            (&local_58.scanner_,(digit *)&local_c0,(character_in_range *)&local_e8,
             (character_in_range *)&local_168);
  local_1a0.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__repeat_at_least_00569a90;
  local_1a0.length_ = 0;
  scanner_storage::scanner_storage<toml::detail::syntax::hexdig,_nullptr>
            (&local_1a0.other_,&local_58);
  local_148.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_00569818;
  local_148.value_ = '.';
  local_c0.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__hexdig_0056a6b0;
  local_e8.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__digit_0056a708;
  local_e8.scanner_.super_scanner_base._vptr_scanner_base =
       (_func_int **)&PTR__scanner_base_005698d8;
  local_e8.scanner_.others_.
  super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>.
  _M_impl.super__Vector_impl_data._M_start._0_2_ = 0x3930;
  local_168.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_005698d8;
  local_168.others_.
  super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>.
  _M_impl.super__Vector_impl_data._M_start._0_2_ = 0x6661;
  local_1f0.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_005698d8;
  local_1f0.chars_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT62(local_1f0.chars_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._2_6_,0x4641);
  either::
  either<toml::detail::syntax::digit,toml::detail::character_in_range,toml::detail::character_in_range>
            (&local_c0.scanner_,(digit *)&local_e8,(character_in_range *)&local_168,
             (character_in_range *)&local_1f0);
  local_1b8.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__repeat_at_least_00569a90;
  local_1b8.length_ = 1;
  scanner_storage::scanner_storage<toml::detail::syntax::hexdig,_nullptr>
            (&local_1b8.other_,&local_c0);
  sequence::
  sequence<toml::detail::repeat_at_least,toml::detail::character,toml::detail::repeat_at_least>
            (&local_98,&local_1a0,&local_148,&local_1b8);
  local_e8.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__hexdig_0056a6b0;
  local_1f0.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__digit_0056a708;
  local_1f0.chars_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__scanner_base_005698d8;
  local_1f0.chars_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._0_2_ = 0x3930;
  local_188.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_005698d8;
  local_188.chars_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_2_ = 0x6661;
  local_210.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_005698d8;
  local_210.length_ = CONCAT62(local_210.length_._2_6_,0x4641);
  either::
  either<toml::detail::syntax::digit,toml::detail::character_in_range,toml::detail::character_in_range>
            (&local_e8.scanner_,(digit *)&local_1f0,(character_in_range *)&local_188,
             (character_in_range *)&local_210);
  local_1d0.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__repeat_at_least_00569a90;
  local_1d0.length_ = 1;
  scanner_storage::scanner_storage<toml::detail::syntax::hexdig,_nullptr>
            (&local_1d0.other_,&local_e8);
  local_220.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__maybe_00569ae8;
  local_220.other_.scanner_._M_t.
  super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
  ._M_t.
  super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
  .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl =
       (unique_ptr<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>)
       operator_new(0x10);
  *(undefined ***)
   local_220.other_.scanner_._M_t.
   super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
   ._M_t.
   super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
   .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl =
       &PTR__scanner_base_00569818;
  *(undefined1 *)
   ((long)local_220.other_.scanner_._M_t.
          super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
          ._M_t.
          super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
          .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl + 8) = 0x2e;
  sequence::sequence<toml::detail::repeat_at_least,toml::detail::maybe>
            (&local_168,&local_1d0,&local_220);
  either::either<toml::detail::sequence,toml::detail::sequence>(&local_78,&local_98,&local_168);
  local_248[2] = 'p';
  local_248[3] = 'P';
  cs_01._M_len = 2;
  cs_01._M_array = local_248 + 2;
  character_either::character_either(&local_1f0,cs_01);
  local_248[0] = '+';
  local_248[1] = '-';
  cs_02._M_len = 2;
  cs_02._M_array = local_248;
  character_either::character_either(&local_188,cs_02);
  local_240.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__maybe_00569ae8;
  scanner_storage::scanner_storage<toml::detail::character_either,_nullptr>
            (&local_240.other_,&local_188);
  local_210.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__repeat_at_least_00569a90;
  local_210.length_ = 1;
  local_210.other_.scanner_._M_t.
  super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
  ._M_t.
  super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
  .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl =
       (unique_ptr<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>)
       operator_new(0x10);
  psVar2 = local_1f8;
  *(undefined ***)
   local_210.other_.scanner_._M_t.
   super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
   ._M_t.
   super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
   .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl =
       &PTR__scanner_base_005698d8;
  *(undefined2 *)
   ((long)local_210.other_.scanner_._M_t.
          super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
          ._M_t.
          super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
          .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl + 8) = 0x3930;
  sequence::
  sequence<toml::detail::maybe,toml::detail::character,toml::detail::character_either,toml::detail::either,toml::detail::character_either,toml::detail::maybe,toml::detail::repeat_at_least>
            (local_1f8,&local_230,&local_118,&local_138,&local_78,&local_1f0,&local_240,&local_210);
  if (local_210.other_.scanner_._M_t.
      super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
      ._M_t.
      super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
      .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl !=
      (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_210.other_.scanner_._M_t.
                          super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
                          .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl +
                8))();
  }
  if (local_240.other_.scanner_._M_t.
      super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
      ._M_t.
      super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
      .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl !=
      (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
       )0x0) {
    (*(*(_func_int ***)
        local_240.other_.scanner_._M_t.
        super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
        ._M_t.
        super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
        .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl)[1])();
  }
  local_240.other_.scanner_._M_t.
  super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
  ._M_t.
  super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
  .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl =
       (unique_ptr<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>)
       (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
        )0x0;
  pvVar1 = (void *)CONCAT62(local_188.chars_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start._2_6_,
                            local_188.chars_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start._0_2_);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,(long)local_188.chars_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar1);
  }
  if ((undefined **)
      local_1f0.chars_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (undefined **)0x0) {
    operator_delete(local_1f0.chars_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f0.chars_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f0.chars_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_78.others_);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_168.others_);
  if (local_220.other_.scanner_._M_t.
      super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
      ._M_t.
      super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
      .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl !=
      (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
       )0x0) {
    (*(*(_func_int ***)
        local_220.other_.scanner_._M_t.
        super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
        ._M_t.
        super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
        .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl)[1])();
  }
  if (local_1d0.other_.scanner_._M_t.
      super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
      ._M_t.
      super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
      .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl !=
      (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
       )0x0) {
    (*(*(_func_int ***)
        local_1d0.other_.scanner_._M_t.
        super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
        ._M_t.
        super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
        .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl)[1])();
  }
  local_1d0.other_.scanner_._M_t.
  super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
  ._M_t.
  super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
  .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl =
       (unique_ptr<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>)
       (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
        )0x0;
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_e8.scanner_.others_);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_98.others_);
  if ((__uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
      )local_1b8.other_.scanner_._M_t.
       super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
       ._M_t.
       super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
       .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
      )0x0) {
    (*(*(_func_int ***)
        local_1b8.other_.scanner_._M_t.
        super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
        ._M_t.
        super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
        .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl)[1])();
  }
  local_1b8.other_.scanner_._M_t.
  super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
  ._M_t.
  super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
  .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl =
       (unique_ptr<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>)
       (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
        )0x0;
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_c0.scanner_.others_);
  if (local_1a0.other_.scanner_._M_t.
      super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
      ._M_t.
      super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
      .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl !=
      (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
       )0x0) {
    (*(*(_func_int ***)
        local_1a0.other_.scanner_._M_t.
        super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
        ._M_t.
        super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
        .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl)[1])();
  }
  local_1a0.other_.scanner_._M_t.
  super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
  ._M_t.
  super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
  .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl =
       (unique_ptr<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>)
       (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
        )0x0;
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_58.scanner_.others_);
  if (local_138.chars_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138.chars_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_138.chars_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.chars_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_230.other_.scanner_._M_t.
      super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
      ._M_t.
      super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
      .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl !=
      (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
       )0x0) {
    (*(*(_func_int ***)
        local_230.other_.scanner_._M_t.
        super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
        ._M_t.
        super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
        .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl)[1])();
  }
  local_230.other_.scanner_._M_t.
  super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
  ._M_t.
  super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
  .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl =
       (unique_ptr<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>)
       (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
        )0x0;
  if (local_108.chars_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_108.chars_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_108.chars_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.chars_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return psVar2;
}

Assistant:

TOML11_INLINE sequence hex_floating(const spec& s)
{
    // C99 hexfloat (%a)
    // [+-]? 0x ( [0-9a-fA-F]*\.[0-9a-fA-F]+ | [0-9a-fA-F]+\.? ) [pP] [+-]? [0-9]+

    // - 0x(int).(frac)p[+-](int)
    // - 0x(int).p[+-](int)
    // - 0x.(frac)p[+-](int)
    // - 0x(int)p[+-](int)

    return sequence(
            maybe(character_either{char_type('+'), char_type('-')}),
            character('0'),
            character_either{char_type('x'), char_type('X')},
            either(
                sequence(
                    repeat_at_least(0, hexdig(s)),
                    character('.'),
                    repeat_at_least(1, hexdig(s))
                ),
                sequence(
                    repeat_at_least(1, hexdig(s)),
                    maybe(character('.'))
                )
            ),
            character_either{char_type('p'), char_type('P')},
            maybe(character_either{char_type('+'), char_type('-')}),
            repeat_at_least(1, character_in_range('0', '9'))
        );
}